

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_substring(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  longdouble lVar1;
  int iVar2;
  lyxp_set *plVar3;
  ushort *puVar4;
  ly_bool lVar5;
  LY_ERR ret__;
  LY_ERR LVar6;
  LY_ERR LVar7;
  char *pcVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  undefined4 uVar14;
  ly_ctx *plVar15;
  ulong uVar16;
  ulong uVar17;
  long local_68;
  ushort uStack_60;
  short sStack_40;
  
  plVar3 = *args;
  if ((options & 0x1c) == 0) {
    uVar9 = 4;
    LVar6 = lyxp_set_cast(plVar3,LYXP_SET_STRING);
    if (LVar6 == LY_SUCCESS) {
      LVar7 = xpath_round(args + 1,uVar9,args[1],options);
      LVar6 = ~LY_SUCCESS;
      if (LVar7 == LY_SUCCESS) {
        lVar1 = *(longdouble *)&args[1]->val;
        uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
        local_68 = SUB108(lVar1,0);
        if (((unkuint10)lVar1 & 0x7fff) == 0 ||
            (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
          uVar17 = (ulong)ROUND(-(longdouble)1 + lVar1);
        }
        else {
          uVar17 = (long)(short)uStack_60 >> 0xf ^ 0x7fffffff;
          if ((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000) {
            uVar17 = 0x7fffffff;
          }
        }
        lVar13 = 0x7fffffff;
        if (arg_count == 3) {
          LVar6 = xpath_round(args + 2,uVar9,args[2],options);
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          lVar1 = (args[2]->val).num;
          sStack_40 = (short)((unkuint10)lVar1 >> 0x40);
          if (sStack_40 < 0 || NAN(lVar1)) {
            lVar13 = 0;
          }
          else {
            lVar13 = 0x7fffffff;
            if (lVar1 != (longdouble)INFINITY) {
              lVar13 = (long)(int)ROUND(lVar1);
            }
          }
        }
        pcVar8 = ((*args)->val).str;
        LVar6 = LY_SUCCESS;
        if (*pcVar8 == '\0') {
          uVar17 = 0;
          uVar9 = 0;
        }
        else {
          uVar16 = 0;
          uVar11 = 1;
          uVar9 = 0;
          uVar10 = 0;
          do {
            if ((long)uVar16 < (long)uVar17) {
              uVar10 = uVar10 + 1;
            }
            else {
              if ((long)(lVar13 + uVar17) <= (long)uVar16) break;
              uVar9 = uVar9 + 1;
            }
            uVar16 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
          } while (pcVar8[uVar16] != '\0');
          uVar17 = (ulong)uVar10;
        }
        set_fill_string(set,pcVar8 + uVar17,uVar9);
      }
    }
  }
  else {
    if (plVar3->type == LYXP_SET_SCNODE_SET) {
      uVar9 = plVar3->used;
      do {
        uVar9 = uVar9 - 1;
        if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
          puVar4 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar9 * 0x18);
          if (puVar4 == (ushort *)0x0) break;
          if ((*puVar4 & 0xc) == 0) {
            plVar15 = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar4);
            pcVar12 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar5 = warn_is_string_type(*(lysc_type **)(puVar4 + 0x30));
            if (lVar5 != '\0') break;
            plVar15 = set->ctx;
            pcVar8 = *(char **)(puVar4 + 0x14);
            pcVar12 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar15,LY_LLWRN,LY_SUCCESS,pcVar12,"xpath_substring",pcVar8);
          break;
        }
      } while (uVar9 != 0);
    }
    plVar3 = args[1];
    if (plVar3->type == LYXP_SET_SCNODE_SET) {
      uVar10 = plVar3->used;
      do {
        uVar10 = uVar10 - 1;
        if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar10 * 0x18 + 0xc) == 2) {
          puVar4 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar10 * 0x18);
          if (puVar4 == (ushort *)0x0) break;
          if ((*puVar4 & 0xc) == 0) {
            plVar15 = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar4);
            pcVar12 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            lVar5 = warn_is_numeric_type(*(lysc_type **)(puVar4 + 0x30));
            if (lVar5 != '\0') break;
            plVar15 = set->ctx;
            pcVar8 = *(char **)(puVar4 + 0x14);
            pcVar12 = "Argument #2 of %s is node \"%s\", not of numeric type.";
          }
          ly_log(plVar15,LY_LLWRN,LY_SUCCESS,pcVar12,"xpath_substring",pcVar8);
          break;
        }
      } while (uVar10 != 0);
    }
    if ((arg_count == 3) && (plVar3 = args[2], plVar3->type == LYXP_SET_SCNODE_SET)) {
      uVar10 = plVar3->used;
      do {
        uVar10 = uVar10 - 1;
        if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar10 * 0x18 + 0xc) == 2) {
          puVar4 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar10 * 0x18);
          if (puVar4 == (ushort *)0x0) break;
          if ((*puVar4 & 0xc) == 0) {
            plVar15 = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar4);
            pcVar12 = "Argument #3 of %s is a %s node \"%s\".";
          }
          else {
            lVar5 = warn_is_numeric_type(*(lysc_type **)(puVar4 + 0x30));
            if (lVar5 != '\0') break;
            plVar15 = set->ctx;
            pcVar8 = *(char **)(puVar4 + 0x14);
            pcVar12 = "Argument #3 of %s is node \"%s\", not of numeric type.";
          }
          ly_log(plVar15,LY_LLWRN,LY_SUCCESS,pcVar12,"xpath_substring",pcVar8);
          break;
        }
      } while (uVar10 != 0);
    }
    uVar10 = set->used;
    if ((ulong)uVar10 != 0) {
      lVar13 = 0;
      do {
        iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar13);
        if (iVar2 == 2) {
          uVar14 = 1;
LAB_001b1b34:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar13) = uVar14;
        }
        else if (iVar2 == -2) {
          uVar14 = 0xffffffff;
          goto LAB_001b1b34;
        }
        lVar13 = lVar13 + 0x18;
      } while ((ulong)uVar10 * 0x18 != lVar13);
    }
    LVar6 = LY_SUCCESS;
  }
  return LVar6;
}

Assistant:

static LY_ERR
xpath_substring(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    int64_t start;
    int32_t len;
    uint32_t str_start, str_len, pos;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }

        if ((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[2]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #3 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #3 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* start */
    if (xpath_round(&args[1], 1, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT32_MIN;
    } else {
        start = INT32_MAX;
    }

    /* len */
    if (arg_count == 3) {
        rc = xpath_round(&args[2], 1, args[2], options);
        LY_CHECK_RET(rc);
        if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else {
            len = INT32_MAX;
        }
    } else {
        len = INT32_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return LY_SUCCESS;
}